

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O2

secp256k1_xonly_pubkey *
cfd::core::GetXOnlyPubkeyFromPubkey
          (secp256k1_xonly_pubkey *__return_storage_ptr__,secp256k1_pubkey *pubkey,bool *parity)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  allocator local_45;
  int pk_parity;
  string local_40;
  
  ctx = wally_get_secp_context();
  pk_parity = 0;
  iVar1 = secp256k1_xonly_pubkey_from_pubkey(ctx,__return_storage_ptr__,&pk_parity,pubkey);
  if (iVar1 == 1) {
    if (parity != (bool *)0x0) {
      *parity = pk_parity != 0;
    }
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Could not get xonly pubkey from pubkey",&local_45);
  CfdException::CfdException(this,kCfdInternalError,&local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

secp256k1_xonly_pubkey GetXOnlyPubkeyFromPubkey(
    const secp256k1_pubkey& pubkey, bool* parity) {
  auto ctx = wally_get_secp_context();
  secp256k1_xonly_pubkey xonly_pubkey;
  int pk_parity = 0;

  auto ret = secp256k1_xonly_pubkey_from_pubkey(
      ctx, &xonly_pubkey, &pk_parity, &pubkey);
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not get xonly pubkey from pubkey");
  }
  if (parity != nullptr) *parity = (pk_parity != 0);

  return xonly_pubkey;
}